

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O1

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>::
     spinlocking_heterogeneous_queue_consume_operation_samples(void)

{
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  *pLVar1;
  ControlBlock *pCVar2;
  uintptr_t uVar3;
  bool bVar4;
  bool bVar5;
  runtime_type<> *prVar6;
  void *i_dest;
  int *piVar7;
  int *piVar8;
  long *plVar9;
  unsigned_long __tmp;
  consume_operation consume;
  type consume_1;
  SpQueue queue;
  Consume local_180;
  Consume local_160;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  local_140;
  Consume local_90 [4];
  
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_next_ptr = 0;
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
        *)0x0;
  local_180.m_control = (ControlBlock *)0x0;
  bVar4 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::empty(&local_180);
  if (!bVar4) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2f4,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::consume_operation::~consume_operation((consume_operation *)&local_180);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)&local_140);
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_140.
  super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
        *)CONCAT44(local_180.m_queue._4_4_,0x2a);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                      *)&local_140,(int *)&local_180);
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
        *)0x0;
  local_180.m_control = (ControlBlock *)0x0;
  local_180.m_next_ptr = 0;
  density::detail::
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  ::Consume::start_consume_impl(&local_180,&local_140);
  local_160.m_queue = local_180.m_queue;
  local_160.m_control = local_180.m_control;
  local_160.m_next_ptr = local_180.m_next_ptr;
  local_180.m_control = (ControlBlock *)0x0;
  local_180.m_next_ptr = 0;
  bVar4 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::empty(&local_180);
  if (bVar4) {
    bVar4 = density::detail::
            LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
            ::Consume::empty(&local_160);
    if (!bVar4) {
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::consume_operation::commit((consume_operation *)&local_160);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::consume_operation::~consume_operation((consume_operation *)&local_160);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::consume_operation::~consume_operation((consume_operation *)&local_180);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                         *)&local_140);
      local_140.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_tail = (ControlBlock *)0xffc0;
      LOCK();
      local_140.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
      UNLOCK();
      local_140.
      super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_180.m_queue._0_4_ = 0x2a;
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
      ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                          *)&local_140,(int *)&local_180);
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
            *)CONCAT44(local_180.m_queue._4_4_,0x2b);
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
      ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                          *)&local_140,(int *)&local_180);
      local_180.m_next_ptr = 0;
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
            *)0x0;
      local_180.m_control = (ControlBlock *)0x0;
      density::detail::
      LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
      ::Consume::start_consume_impl(&local_180,&local_140);
      local_160.m_queue = local_180.m_queue;
      local_160.m_control = local_180.m_control;
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
            *)0x0;
      local_180.m_control = (ControlBlock *)0x0;
      local_160.m_next_ptr = local_180.m_next_ptr;
      local_180.m_next_ptr = 0;
      bVar4 = density::detail::
              LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
              ::Consume::empty(&local_180);
      if (bVar4) {
        bVar4 = density::detail::
                LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                ::Consume::empty(&local_160);
        if (!bVar4) {
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit((consume_operation *)&local_160);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue._0_4_ = 0x2a;
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_90[0].m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_90[0].m_control = (ControlBlock *)0x0;
          local_90[0].m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(local_90,&local_140);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)local_90);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          if (!bVar4) {
            __assert_fail("consume.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x339,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          local_160.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          uVar3 = local_180.m_next_ptr;
          pCVar2 = local_180.m_control;
          pLVar1 = local_180.m_queue;
          local_180.m_queue = local_160.m_queue;
          local_160.m_queue = pLVar1;
          local_180.m_control = local_160.m_control;
          local_180.m_next_ptr = local_160.m_next_ptr;
          local_160.m_control = pCVar2;
          local_160.m_next_ptr = uVar3;
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          if (bVar4) {
            __assert_fail("!consume.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x33b,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          bVar5 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          if (bVar4 != bVar5) {
            __assert_fail("consume.empty() == !consume",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x346,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          local_160.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          uVar3 = local_180.m_next_ptr;
          pCVar2 = local_180.m_control;
          pLVar1 = local_180.m_queue;
          local_180.m_queue = local_160.m_queue;
          local_160.m_queue = pLVar1;
          local_180.m_control = local_160.m_control;
          local_180.m_next_ptr = local_160.m_next_ptr;
          local_160.m_control = pCVar2;
          local_160.m_next_ptr = uVar3;
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          bVar5 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  ::Consume::empty(&local_180);
          if (bVar4 != bVar5) {
            __assert_fail("consume.empty() == !consume",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x348,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<std::__cxx11::string,char_const(&)[4]>
                    ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                      *)&local_140,(char (*) [4])"abc");
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          i_dest = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::element_ptr((consume_operation *)&local_180);
          density::runtime_type<>::destroy(prVar6,i_dest);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit_nodestroy((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::cancel((consume_operation *)&local_180);
          local_160.m_next_ptr = 0;
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          piVar7 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::element<int>((consume_operation *)&local_160);
          if (*piVar7 != 0x2a) {
            __assert_fail("queue.try_start_consume().template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x366,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume.complete_type().template is<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x372,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x374,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          piVar7 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::element<int>((consume_operation *)&local_180);
          if (*piVar7 != 0x2a) {
            __assert_fail("consume.template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x375,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          piVar7 = (int *)density::
                          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                          ::consume_operation::element_ptr((consume_operation *)&local_180);
          *piVar7 = *piVar7 + 1;
          piVar7 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::element<int>((consume_operation *)&local_180);
          if (*piVar7 != 0x2b) {
            __assert_fail("consume.template element<int>() == 43",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,899,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          local_160.m_next_ptr = local_180.m_next_ptr;
          local_160.m_queue = local_180.m_queue;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_160.m_control = local_180.m_control;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_160);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume_2.complete_type().template is<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x395,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_160);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x397,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          piVar7 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::element<int>((consume_operation *)&local_160);
          if (*piVar7 != 0x2a) {
            __assert_fail("consume_2.template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x398,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit((consume_operation *)&local_160);
          bVar4 = density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::empty((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                           *)&local_140);
          if (!bVar4) {
            __assert_fail("queue.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x39b,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          piVar7 = (int *)density::
                          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                          ::consume_operation::unaligned_element_ptr
                                    ((consume_operation *)&local_180);
          piVar8 = (int *)density::
                          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                          ::consume_operation::element_ptr((consume_operation *)&local_180);
          if (piVar7 != piVar8) {
            __assert_fail("unaligned_ptr == consume.element_ptr()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x3b0,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          if (((ulong)piVar7 & 3) != 0) {
            __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                          ,0x3b3,
                          "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                         );
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
          plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                             *)&local_140);
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_tail = (ControlBlock *)0xffc0;
          LOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
          UNLOCK();
          local_140.
          super_SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          ::emplace<int,int>((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table ==
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
            piVar7 = density::
                     sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     ::consume_operation::element<int>((consume_operation *)&local_180);
            plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            density::
            sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::consume_operation::commit((consume_operation *)&local_180);
            density::
            sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::consume_operation::~consume_operation((consume_operation *)&local_180);
            density::
            sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                               *)&local_140);
            return;
          }
          __assert_fail("consume.complete_type().template is<int>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                        ,0x3c1,
                        "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                       );
        }
      }
      __assert_fail("consume.empty() && !consume_1.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,799,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
  }
  __assert_fail("consume.empty() && !consume_1.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x30e,
                "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_consume_operation_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue consume_operation default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        typename SpQueue::consume_operation consume;
        assert(consume.empty());
        //! [sp_heter_queue consume_operation default_construct example 1]
    }

    //! [sp_heter_queue consume_operation copy_construct example 1]
    using SpQueue =
      sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

    static_assert(!std::is_copy_constructible<typename SpQueue::consume_operation>::value, "");
    //! [sp_heter_queue consume_operation copy_construct example 1]

    //! [sp_heter_queue consume_operation copy_assign example 1]
    static_assert(!std::is_copy_assignable<typename SpQueue::consume_operation>::value, "");
    //! [sp_heter_queue consume_operation copy_assign example 1]

    {
        //! [sp_heter_queue consume_operation move_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);
        auto consume = queue.try_start_consume();

        auto consume_1 = std::move(consume);
        assert(consume.empty() && !consume_1.empty());
        consume_1.commit();
        //! [sp_heter_queue consume_operation move_construct example 1]
    }
    {
        //! [sp_heter_queue consume_operation move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);
        queue.push(43);
        auto consume = queue.try_start_consume();

        typename SpQueue::consume_operation consume_1;
        consume_1 = std::move(consume);
        assert(consume.empty() && !consume_1.empty());
        consume_1.commit();
        //! [sp_heter_queue consume_operation move_assign example 1]
    }
    {
        //! [sp_heter_queue consume_operation destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.push(42);

        // this consumed is started and destroyed before being committed, so it has no observable effects
        queue.try_start_consume();
        //! [sp_heter_queue consume_operation destroy example 1]
    }
    {
        //! [sp_heter_queue consume_operation empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume;
        assert(consume.empty());
        consume = queue.try_start_consume();
        assert(!consume.empty());
        //! [sp_heter_queue consume_operation empty example 1]
    }
    {
        //! [sp_heter_queue consume_operation operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::consume_operation consume;
        assert(consume.empty() == !consume);
        consume = queue.try_start_consume();
        assert(consume.empty() == !consume);
        //! [sp_heter_queue consume_operation operator_bool example 1]
    }
    {
        //! [sp_heter_queue consume_operation commit_nodestroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.template emplace<std::string>("abc");

        typename SpQueue::consume_operation consume = queue.try_start_consume();
        consume.complete_type().destroy(consume.element_ptr());

        // the string has already been destroyed. Calling commit would trigger an undefined behavior
        consume.commit_nodestroy();
        //! [sp_heter_queue consume_operation commit_nodestroy example 1]
    }
    {
        //! [sp_heter_queue consume_operation cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume = queue.try_start_consume();
        consume.cancel();

        // there is still a 42 in the queue
        assert(queue.try_start_consume().template element<int>() == 42);
        //! [sp_heter_queue consume_operation cancel example 1]
    }
    {
        //! [sp_heter_queue consume_operation complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume = queue.try_start_consume();
        assert(consume.complete_type().template is<int>());
        assert(
          consume.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        assert(consume.template element<int>() == 42);
        consume.commit();
        //! [sp_heter_queue consume_operation complete_type example 1]
    }
    {
        //! [sp_heter_queue consume_operation element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume = queue.try_start_consume();
        ++*static_cast<int *>(consume.element_ptr());
        assert(consume.template element<int>() == 43);
        consume.commit();
        //! [sp_heter_queue consume_operation element_ptr example 1]
    }
    {
        //! [sp_heter_queue consume_operation swap example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume_1 = queue.try_start_consume();
        typename SpQueue::consume_operation consume_2;
        {
            using namespace std;
            swap(consume_1, consume_2);
        }
        assert(consume_2.complete_type().template is<int>());
        assert(
          consume_2.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();

        assert(queue.empty());
        //! [sp_heter_queue consume_operation swap example 1]
    }
    {
        //! [sp_heter_queue consume_operation unaligned_element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume        = queue.try_start_consume();
        bool const                          is_overaligned = alignof(int) > SpQueue::min_alignment;
        void * const                        unaligned_ptr  = consume.unaligned_element_ptr();
        int *                               element_ptr;
        if (is_overaligned)
        {
            element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
        }
        else
        {
            assert(unaligned_ptr == consume.element_ptr());
            element_ptr = static_cast<int *>(unaligned_ptr);
        }
        assert(address_is_aligned(element_ptr, alignof(int)));
        std::cout << "An int: " << *element_ptr << std::endl;
        consume.commit();
        //! [sp_heter_queue consume_operation unaligned_element_ptr example 1]
    }
    {
        //! [sp_heter_queue consume_operation element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.push(42);

        typename SpQueue::consume_operation consume = queue.try_start_consume();
        assert(consume.complete_type().template is<int>());
        std::cout << "An int: " << consume.template element<int>() << std::endl;
        /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
                trigger an undefined behavior, because the element is not a float */
        consume.commit();
        //! [sp_heter_queue consume_operation element example 1]
    }
}